

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# binaryen-c.cpp
# Opt level: O0

bool ExpressionRunnerSetGlobalValue
               (ExpressionRunnerRef runner,char *name,BinaryenExpressionRef value)

{
  char *this;
  bool bVar1;
  string_view local_98 [2];
  undefined1 local_78 [8];
  Flow setFlow;
  CExpressionRunner *R;
  BinaryenExpressionRef value_local;
  char *name_local;
  ExpressionRunnerRef runner_local;
  
  setFlow.breakTo.super_IString.str._M_str = (char *)runner;
  wasm::ExpressionRunner<wasm::CExpressionRunner>::visit
            ((Flow *)local_78,(ExpressionRunner<wasm::CExpressionRunner> *)runner,value);
  bVar1 = wasm::Flow::breaking((Flow *)local_78);
  this = setFlow.breakTo.super_IString.str._M_str;
  if (!bVar1) {
    wasm::Name::Name((Name *)local_98,name);
    wasm::ConstantExpressionRunner<wasm::CExpressionRunner>::setGlobalValue
              ((ConstantExpressionRunner<wasm::CExpressionRunner> *)this,(Name)local_98[0],
               (Literals *)local_78);
  }
  runner_local._7_1_ = !bVar1;
  wasm::Flow::~Flow((Flow *)local_78);
  return runner_local._7_1_;
}

Assistant:

bool ExpressionRunnerSetGlobalValue(ExpressionRunnerRef runner,
                                    const char* name,
                                    BinaryenExpressionRef value) {
  auto* R = (CExpressionRunner*)runner;
  auto setFlow = R->visit(value);
  if (!setFlow.breaking()) {
    R->setGlobalValue(name, setFlow.values);
    return 1;
  }
  return 0;
}